

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CIF::Utilities::split
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *s,string *delims)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elems;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = 0;
  local_68 = 0;
  uStack_60 = 0;
  do {
    std::__cxx11::string::find_first_not_of((string *)s,(ulong)delims);
    std::__cxx11::string::find_first_of((string *)s,(ulong)delims);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

std::vector<std::string> split(const std::string &s, std::string delims) {
        size_t beg, pos = 0;
        std::vector<std::string> elems;
        while ((beg = s.find_first_not_of(delims, pos)) != std::string::npos)
        {
            pos = s.find_first_of(delims, beg + 1);
            elems.push_back(s.substr(beg, pos - beg));
        }
    }